

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_vec2 nk_widget_size(nk_context *ctx)

{
  long lVar1;
  nk_rect *in_RDI;
  nk_rect bounds;
  float in_stack_ffffffffffffffe8;
  float in_stack_ffffffffffffffec;
  nk_vec2 local_8;
  
  if ((in_RDI == (nk_rect *)0x0) ||
     (lVar1._0_4_ = in_RDI[0x40d].w, lVar1._4_4_ = in_RDI[0x40d].h, lVar1 == 0)) {
    local_8 = nk_vec2(0.0,0.0);
  }
  else {
    nk_layout_peek(in_RDI,(nk_context *)
                          CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    local_8 = nk_vec2(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffec);
  }
  return local_8;
}

Assistant:

NK_API struct nk_vec2
nk_widget_size(struct nk_context *ctx)
{
struct nk_rect bounds;
NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
if (!ctx || !ctx->current)
return nk_vec2(0,0);

nk_layout_peek(&bounds, ctx);
return nk_vec2(bounds.w, bounds.h);
}